

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optimizer.cpp
# Opt level: O0

void __thiscall
calc4::anon_unknown_23::PrecomputeVisitor<int>::Visit
          (PrecomputeVisitor<int> *this,shared_ptr<const_calc4::UserDefinedOperator> *op)

{
  bool bVar1;
  element_type *peVar2;
  OperatorDefinition *__r;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  *in_RDI;
  shared_ptr<const_calc4::Operator> *op2;
  iterator __end3;
  iterator __begin3;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  *__range3;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  operands;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  *in_stack_ffffffffffffff58;
  optional<bool> local_92;
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  *in_stack_ffffffffffffff70;
  PrecomputeVisitor<int> *in_stack_ffffffffffffff78;
  OperatorDefinition *in_stack_ffffffffffffff80;
  _Optional_payload_base<bool> in_stack_ffffffffffffff8e;
  __normal_iterator<std::shared_ptr<const_calc4::Operator>_*,_std::vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>_>
  local_60 [3];
  undefined1 local_48 [24];
  undefined1 *local_30;
  
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::vector((vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
            *)0x13fba1);
  peVar2 = std::
           __shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13fbae);
  (*(peVar2->super_Operator)._vptr_Operator[1])(local_48);
  local_30 = local_48;
  local_60[0]._M_current =
       (shared_ptr<const_calc4::Operator> *)
       std::
       vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
       ::begin(in_stack_ffffffffffffff58);
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::end(in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<const_calc4::Operator>_*,_std::vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::shared_ptr<const_calc4::Operator>_*,_std::vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_calc4::Operator>_*,_std::vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>_>
    ::operator*(local_60);
    Precompute(in_stack_ffffffffffffff78,
               (shared_ptr<const_calc4::Operator> *)in_stack_ffffffffffffff70);
    std::
    vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
    ::push_back(in_RDI,(value_type *)in_stack_ffffffffffffff58);
    std::shared_ptr<const_calc4::Operator>::~shared_ptr
              ((shared_ptr<const_calc4::Operator> *)0x13fc61);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<const_calc4::Operator>_*,_std::vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>_>
    ::operator++(local_60);
  }
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::~vector(in_stack_ffffffffffffff70);
  peVar2 = std::
           __shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_calc4::UserDefinedOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13fcb1);
  __r = UserDefinedOperator::GetDefinition(peVar2);
  std::optional<bool>::optional(&local_92);
  UserDefinedOperator::Create
            (in_stack_ffffffffffffff80,
             (vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
              *)in_stack_ffffffffffffff78,(optional<bool>)in_stack_ffffffffffffff8e);
  std::shared_ptr<calc4::Operator_const>::operator=
            ((shared_ptr<const_calc4::Operator> *)in_RDI,
             (shared_ptr<const_calc4::UserDefinedOperator> *)__r);
  std::shared_ptr<const_calc4::UserDefinedOperator>::~shared_ptr
            ((shared_ptr<const_calc4::UserDefinedOperator> *)0x13fd01);
  std::
  vector<std::shared_ptr<const_calc4::Operator>,_std::allocator<std::shared_ptr<const_calc4::Operator>_>_>
  ::~vector(in_stack_ffffffffffffff70);
  return;
}

Assistant:

virtual void Visit(const std::shared_ptr<const UserDefinedOperator>& op) override
    {
        std::vector<std::shared_ptr<const Operator>> operands;

        for (auto& op2 : op->GetOperands())
        {
            operands.push_back(Precompute(op2));
        }

        value = UserDefinedOperator::Create(op->GetDefinition(), std::move(operands));
    }